

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<true,duckdb::string_t,duckdb::GreaterThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  undefined8 *puVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  unsigned_long *puVar7;
  const_reference pvVar8;
  idx_t iVar9;
  SelectionVector *pSVar10;
  idx_t iVar11;
  idx_t iVar12;
  bool bVar13;
  idx_t local_70;
  anon_union_16_2_67f50693_for_value local_40;
  
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar3 = (lhs_format->unified).sel;
    pdVar2 = (lhs_format->unified).data;
    pdVar4 = rhs_row_locations->data;
    pvVar8 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar5 = *pvVar8;
      local_70 = 0;
      iVar12 = 0;
      do {
        iVar11 = iVar12;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar12];
        }
        psVar6 = pSVar3->sel_vector;
        iVar9 = iVar11;
        if (psVar6 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar6[iVar11];
        }
        puVar1 = (undefined8 *)(*(long *)(pdVar4 + iVar11 * 8) + vVar5);
        local_40._0_8_ = *puVar1;
        local_40.pointer.ptr = (char *)puVar1[1];
        if (((1 << ((byte)col_idx & 7) &
             (uint)*(byte *)(*(long *)(pdVar4 + iVar11 * 8) + (col_idx >> 3))) == 0) ||
           (bVar13 = string_t::StringComparisonOperators::GreaterThan
                               ((string_t *)(pdVar2 + iVar9 * 0x10),(string_t *)&local_40.pointer),
           !bVar13)) {
          iVar9 = *no_match_count;
          *no_match_count = iVar9 + 1;
          pSVar10 = no_match_sel;
        }
        else {
          iVar9 = local_70;
          pSVar10 = sel;
          local_70 = local_70 + 1;
        }
        pSVar10->sel_vector[iVar9] = (sel_t)iVar11;
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
      return local_70;
    }
  }
  else {
    pdVar2 = rhs_row_locations->data;
    pSVar3 = (lhs_format->unified).sel;
    pdVar4 = (lhs_format->unified).data;
    pvVar8 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar5 = *pvVar8;
      local_70 = 0;
      iVar12 = 0;
      do {
        iVar11 = iVar12;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar12];
        }
        psVar6 = pSVar3->sel_vector;
        iVar9 = iVar11;
        if (psVar6 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar6[iVar11];
        }
        puVar7 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
                 validity_mask;
        if (puVar7 == (unsigned_long *)0x0) {
          bVar13 = false;
        }
        else {
          bVar13 = (puVar7[iVar9 >> 6] >> (iVar9 & 0x3f) & 1) == 0;
        }
        puVar1 = (undefined8 *)(*(long *)(pdVar2 + iVar11 * 8) + vVar5);
        local_40._0_8_ = *puVar1;
        local_40.pointer.ptr = (char *)puVar1[1];
        if (((bVar13) ||
            (((uint)*(byte *)(*(long *)(pdVar2 + iVar11 * 8) + (col_idx >> 3)) &
             1 << ((byte)col_idx & 7)) == 0)) ||
           (bVar13 = string_t::StringComparisonOperators::GreaterThan
                               ((string_t *)(pdVar4 + iVar9 * 0x10),(string_t *)&local_40.pointer),
           !bVar13)) {
          iVar9 = *no_match_count;
          *no_match_count = iVar9 + 1;
          pSVar10 = no_match_sel;
        }
        else {
          iVar9 = local_70;
          pSVar10 = sel;
          local_70 = local_70 + 1;
        }
        pSVar10->sel_vector[iVar9] = (sel_t)iVar11;
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
      return local_70;
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}